

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_rev16(TCGContext_conflict1 *tcg_ctx,TCGv_i32 dest,TCGv_i32 var)

{
  TCGv_i32 ret;
  TCGv_i32 arg2;
  uintptr_t o;
  uintptr_t o_1;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  arg2 = tcg_const_i32_aarch64(tcg_ctx,0xff00ff);
  tcg_gen_shri_i32_aarch64(tcg_ctx,ret,var,8);
  tcg_gen_and_i32(tcg_ctx,ret,ret,arg2);
  tcg_gen_and_i32(tcg_ctx,var,var,arg2);
  tcg_gen_shli_i32_aarch64(tcg_ctx,var,var,8);
  tcg_gen_or_i32(tcg_ctx,dest,var,ret);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_rev16(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 var)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 mask = tcg_const_i32(tcg_ctx, 0x00ff00ff);
    tcg_gen_shri_i32(tcg_ctx, tmp, var, 8);
    tcg_gen_and_i32(tcg_ctx, tmp, tmp, mask);
    tcg_gen_and_i32(tcg_ctx, var, var, mask);
    tcg_gen_shli_i32(tcg_ctx, var, var, 8);
    tcg_gen_or_i32(tcg_ctx, dest, var, tmp);
    tcg_temp_free_i32(tcg_ctx, mask);
    tcg_temp_free_i32(tcg_ctx, tmp);
}